

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

void ExportSkin(Asset *mAsset,aiMesh *aimesh,Ref<glTF2::Mesh> *meshRef,Ref<glTF2::Buffer> *bufferRef
               ,Ref<glTF2::Skin> *skinRef,
               vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
               *inverseBindMatricesData)

{
  aiBone *paVar1;
  Skin *pSVar2;
  pointer pPVar3;
  Accessor *pAVar4;
  long *plVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  void *pvVar10;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar11;
  uint8_t *pReplace_Data;
  uint uVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  void *pvVar17;
  ulong uVar18;
  Ref<glTF2::Buffer> *buffer;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  Ref<glTF2::Node> RVar22;
  Ref<glTF2::Accessor> RVar23;
  value_type local_b0;
  Ref<glTF2::Buffer> *local_a0;
  void *local_98;
  void *local_90;
  size_t local_88;
  void *local_80;
  value_type local_78;
  
  uVar7 = aimesh->mNumBones;
  if (uVar7 != 0) {
    uVar15 = (ulong)aimesh->mNumVertices;
    pvVar9 = operator_new__(uVar15 << 4);
    pvVar10 = operator_new__(uVar15 << 4);
    local_98 = operator_new__(uVar15 * 4);
    pvVar13 = pvVar10;
    pvVar17 = pvVar9;
    for (uVar20 = 0; uVar20 != uVar15; uVar20 = uVar20 + 1) {
      *(undefined4 *)((long)local_98 + uVar20 * 4) = 0;
      for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
        *(undefined4 *)((long)pvVar17 + lVar19 * 4) = 0;
        *(undefined4 *)((long)pvVar13 + lVar19 * 4) = 0;
      }
      pvVar17 = (void *)((long)pvVar17 + 0x10);
      pvVar13 = (void *)((long)pvVar13 + 0x10);
    }
    local_a0 = bufferRef;
    local_90 = pvVar10;
    local_80 = pvVar9;
    for (uVar15 = 0; pvVar13 = local_80, buffer = local_a0, uVar15 < uVar7; uVar15 = uVar15 + 1) {
      paVar1 = aimesh->mBones[uVar15];
      RVar22 = glTF2::LazyDict<glTF2::Node>::Get(&mAsset->nodes,(paVar1->mName).data);
      local_b0.vector =
           (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)RVar22.vector;
      local_b0.index = RVar22.index;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(((_Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
                   &(local_b0.vector)->
                    super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)->
                  _M_impl).super__Vector_impl_data._M_start[local_b0.index]->jointName);
      bVar21 = true;
      uVar7 = 0;
      uVar20 = 0;
      while( true ) {
        uVar14 = (ulong)uVar7;
        pSVar2 = (skinRef->vector->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[skinRef->index];
        lVar19 = *(long *)&(pSVar2->jointNames).
                           super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                           ._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pSVar2->jointNames).
                                   super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                           + 8) - lVar19 >> 4) <= uVar14) break;
        iVar6 = std::__cxx11::string::compare
                          ((string *)
                           (*(long *)(**(long **)(lVar19 + uVar14 * 0x10) +
                                     (ulong)*(uint *)(lVar19 + 8 + uVar14 * 0x10) * 8) + 0x140));
        if (iVar6 == 0) {
          uVar20 = uVar14;
        }
        bVar21 = (bool)(bVar21 & iVar6 != 0);
        uVar7 = uVar7 + 1;
      }
      if (bVar21) {
        std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::push_back
                  (&pSVar2->jointNames,(value_type *)&local_b0);
        local_78._0_8_ = *(undefined8 *)&paVar1->mOffsetMatrix;
        local_78.a3 = (paVar1->mOffsetMatrix).a3;
        local_78.a4 = (paVar1->mOffsetMatrix).a4;
        local_78.b1 = (paVar1->mOffsetMatrix).b1;
        local_78.b2 = (paVar1->mOffsetMatrix).b2;
        local_78.b3 = (paVar1->mOffsetMatrix).b3;
        local_78.b4 = (paVar1->mOffsetMatrix).b4;
        local_78.c1 = (paVar1->mOffsetMatrix).c1;
        local_78.c2 = (paVar1->mOffsetMatrix).c2;
        local_78.c3 = (paVar1->mOffsetMatrix).c3;
        local_78.c4 = (paVar1->mOffsetMatrix).c4;
        local_78.d1 = (paVar1->mOffsetMatrix).d1;
        local_78.d2 = (paVar1->mOffsetMatrix).d2;
        local_78.d3 = (paVar1->mOffsetMatrix).d3;
        local_78.d4 = (paVar1->mOffsetMatrix).d4;
        std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::push_back
                  (inverseBindMatricesData,&local_78);
        uVar20 = (ulong)((int)((ulong)((long)(inverseBindMatricesData->
                                             super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(inverseBindMatricesData->
                                            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 6) - 1);
      }
      uVar7 = paVar1->mNumWeights;
      for (uVar14 = 0; uVar14 < uVar7; uVar14 = uVar14 + 1) {
        uVar18 = (ulong)paVar1->mWeights[uVar14].mVertexId;
        iVar6 = *(int *)((long)local_98 + uVar18 * 4);
        lVar19 = (long)iVar6;
        if (lVar19 < 4) {
          fVar16 = paVar1->mWeights[uVar14].mWeight;
          *(float *)((long)local_80 + lVar19 * 4 + uVar18 * 0x10) = (float)uVar20;
          *(float *)((long)local_90 + lVar19 * 4 + uVar18 * 0x10) = fVar16;
          *(int *)((long)local_98 + uVar18 * 4) = iVar6 + 1;
        }
      }
      uVar7 = aimesh->mNumBones;
    }
    pPVar3 = *(pointer *)
              ((long)&((meshRef->vector->
                       super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[meshRef->index]->primitives).
                      super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
              + 8);
    RVar23 = ExportData(mAsset,&((skinRef->vector->
                                 super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                super_Object).id,local_a0,(ulong)aimesh->mNumVertices,local_80,VEC4,
                        VEC4,ComponentType_FLOAT,false);
    pvVar11 = RVar23.vector;
    fVar16 = (float)RVar23.index;
    local_78.a3 = fVar16;
    local_78._0_8_ = pvVar11;
    if (pvVar11 != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
      pAVar4 = (pvVar11->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[(uint)fVar16];
      lVar19 = *(long *)(*(long *)&(((pAVar4->bufferView).vector)->
                                   super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                   )._M_impl + (ulong)(pAVar4->bufferView).index * 8);
      local_88 = *(size_t *)(lVar19 + 0x60);
      uVar15 = *(ulong *)(lVar19 + 0x68);
      uVar7 = glTF2::ComponentTypeSize(pAVar4->componentType);
      pAVar4 = (pvVar11->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[(uint)fVar16];
      lVar19 = *(long *)(*(long *)&(((pAVar4->bufferView).vector)->
                                   super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                   )._M_impl + (ulong)(pAVar4->bufferView).index * 8);
      plVar5 = *(long **)(lVar19 + 0x50);
      uVar20 = (ulong)*(uint *)(lVar19 + 0x58);
      pReplace_Data = (uint8_t *)operator_new__(uVar15);
      uVar8 = 0;
      for (uVar12 = 0; uVar12 <= uVar15; uVar12 = uVar12 + uVar7) {
        *(short *)(pReplace_Data + uVar8) =
             (short)(int)*(float *)((ulong)uVar12 +
                                   *(long *)(*(long *)(*plVar5 + uVar20 * 8) + 0x70) + local_88);
        uVar8 = uVar8 + 2;
      }
      glTF2::Buffer::ReplaceData_joint
                (*(Buffer **)(*plVar5 + uVar20 * 8),local_88,uVar15,pReplace_Data,uVar15);
      (pvVar11->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
      super__Vector_impl_data._M_start[(uint)fVar16]->componentType = ComponentType_UNSIGNED_SHORT;
      pAVar4 = (pvVar11->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[(uint)fVar16];
      *(ulong *)(*(long *)(*(long *)&(((pAVar4->bufferView).vector)->
                                     super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                     )._M_impl + (ulong)(pAVar4->bufferView).index * 8) + 0x68) =
           (uVar15 * 2) / (ulong)uVar7;
      std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
      push_back(&pPVar3[-1].attributes.joint,(value_type *)&local_78);
      operator_delete__(pReplace_Data);
      buffer = local_a0;
    }
    pvVar17 = local_90;
    RVar23 = ExportData(mAsset,&((skinRef->vector->
                                 super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                super_Object).id,buffer,(ulong)aimesh->mNumVertices,local_90,VEC4,
                        VEC4,ComponentType_FLOAT,false);
    local_b0.vector = RVar23.vector;
    local_b0.index = RVar23.index;
    if (local_b0.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
      std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
      push_back(&pPVar3[-1].attributes.weight,&local_b0);
    }
    operator_delete__(local_98);
    operator_delete__(pvVar17);
    operator_delete__(pvVar13);
  }
  return;
}

Assistant:

void ExportSkin(Asset& mAsset, const aiMesh* aimesh, Ref<Mesh>& meshRef, Ref<Buffer>& bufferRef, Ref<Skin>& skinRef, std::vector<aiMatrix4x4>& inverseBindMatricesData)
{
    if (aimesh->mNumBones < 1) {
        return;
    }

    // Store the vertex joint and weight data.
    const size_t NumVerts( aimesh->mNumVertices );
    vec4* vertexJointData = new vec4[ NumVerts ];
    vec4* vertexWeightData = new vec4[ NumVerts ];
    int* jointsPerVertex = new int[ NumVerts ];
    for (size_t i = 0; i < NumVerts; ++i) {
        jointsPerVertex[i] = 0;
        for (size_t j = 0; j < 4; ++j) {
            vertexJointData[i][j] = 0;
            vertexWeightData[i][j] = 0;
        }
    }

    for (unsigned int idx_bone = 0; idx_bone < aimesh->mNumBones; ++idx_bone) {
        const aiBone* aib = aimesh->mBones[idx_bone];

        // aib->mName   =====>  skinRef->jointNames
        // Find the node with id = mName.
        Ref<Node> nodeRef = mAsset.nodes.Get(aib->mName.C_Str());
        nodeRef->jointName = nodeRef->name;

        unsigned int jointNamesIndex = 0;
        bool addJointToJointNames = true;
        for ( unsigned int idx_joint = 0; idx_joint < skinRef->jointNames.size(); ++idx_joint) {
            if (skinRef->jointNames[idx_joint]->jointName.compare(nodeRef->jointName) == 0) {
                addJointToJointNames = false;
                jointNamesIndex = idx_joint;
            }
        }

        if (addJointToJointNames) {
            skinRef->jointNames.push_back(nodeRef);

            // aib->mOffsetMatrix   =====>  skinRef->inverseBindMatrices
            aiMatrix4x4 tmpMatrix4;
            CopyValue(aib->mOffsetMatrix, tmpMatrix4);
            inverseBindMatricesData.push_back(tmpMatrix4);
            jointNamesIndex = static_cast<unsigned int>(inverseBindMatricesData.size() - 1);
        }

        // aib->mWeights   =====>  vertexWeightData
        for (unsigned int idx_weights = 0; idx_weights < aib->mNumWeights; ++idx_weights) {
            unsigned int vertexId = aib->mWeights[idx_weights].mVertexId;
            float vertWeight      = aib->mWeights[idx_weights].mWeight;

            // A vertex can only have at most four joint weights. Ignore all others.
            if (jointsPerVertex[vertexId] > 3) {
                continue;
            }

            vertexJointData[vertexId][jointsPerVertex[vertexId]] = static_cast<float>(jointNamesIndex);
            vertexWeightData[vertexId][jointsPerVertex[vertexId]] = vertWeight;

            jointsPerVertex[vertexId] += 1;
        }

    } // End: for-loop mNumMeshes

    Mesh::Primitive& p = meshRef->primitives.back();
    Ref<Accessor> vertexJointAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexJointData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexJointAccessor ) {
        size_t offset = vertexJointAccessor->bufferView->byteOffset;
        size_t bytesLen = vertexJointAccessor->bufferView->byteLength;
        unsigned int s_bytesPerComp= ComponentTypeSize(ComponentType_UNSIGNED_SHORT);
        unsigned int bytesPerComp = ComponentTypeSize(vertexJointAccessor->componentType);
        size_t s_bytesLen = bytesLen * s_bytesPerComp / bytesPerComp;
        Ref<Buffer> buf = vertexJointAccessor->bufferView->buffer;
        uint8_t* arrys = new uint8_t[bytesLen];
        unsigned int i = 0;
        for ( unsigned int j = 0; j <= bytesLen; j += bytesPerComp ){
            size_t len_p = offset + j;
            float f_value = *(float *)&buf->GetPointer()[len_p];
            unsigned short c = static_cast<unsigned short>(f_value);
            memcpy(&arrys[i*s_bytesPerComp], &c, s_bytesPerComp);
            ++i;
        }
        buf->ReplaceData_joint(offset, bytesLen, arrys, bytesLen);
        vertexJointAccessor->componentType = ComponentType_UNSIGNED_SHORT;
        vertexJointAccessor->bufferView->byteLength = s_bytesLen;

        p.attributes.joint.push_back( vertexJointAccessor );
        delete[] arrys;
    }

    Ref<Accessor> vertexWeightAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices,
            vertexWeightData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexWeightAccessor ) {
        p.attributes.weight.push_back( vertexWeightAccessor );
    }
    delete[] jointsPerVertex;
    delete[] vertexWeightData;
    delete[] vertexJointData;
}